

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O1

int32_t __thiscall helics::EndpointInfo::getProperty(EndpointInfo *this,int32_t option)

{
  byte bVar1;
  
  bVar1 = 0;
  if (option < 0x199) {
    if (option == 0x18d) {
      bVar1 = this->required;
    }
    else if (option == 0x192) {
      bVar1 = this->required ^ 1;
    }
    else if (option == 0x197) {
      bVar1 = this->requiredConnections == 1;
    }
  }
  else if (option < 0x1a7) {
    if (option == 0x199) {
      bVar1 = this->requiredConnections != 1;
    }
    else {
      bVar1 = 0;
      if (option == 0x1a6) {
        bVar1 = this->receiveOnly;
      }
    }
  }
  else if (option == 0x1a7) {
    bVar1 = this->sourceOnly;
  }
  else if (option == 0x20a) {
    return (int)((ulong)((long)(this->targetInformation).
                               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->targetInformation).
                              super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
  }
  return (int32_t)bVar1;
}

Assistant:

int32_t EndpointInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (requiredConnections == 1);
            break;
        case defs::Options::SEND_ONLY:
            flagval = sourceOnly;
            break;
        case defs::Options::RECEIVE_ONLY:
            flagval = receiveOnly;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = (requiredConnections != 1);
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(targetInformation.size());
        default:
            break;
    }
    return flagval ? 1 : 0;
}